

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

vector<Tigre::String,_std::allocator<Tigre::String>_> * __thiscall
Tigre::String::explode
          (vector<Tigre::String,_std::allocator<Tigre::String>_> *__return_storage_ptr__,
          String *this,String *delimitador)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  string local_100;
  String local_e0;
  string local_c0;
  String local_a0;
  string local_70;
  String local_50;
  int local_2c;
  int local_28;
  int i;
  int last_push;
  String *delimitador_local;
  String *this_local;
  vector<Tigre::String,_std::allocator<Tigre::String>_> *result;
  
  i._3_1_ = 0;
  _last_push = delimitador;
  delimitador_local = this;
  this_local = (String *)__return_storage_ptr__;
  std::vector<Tigre::String,_std::allocator<Tigre::String>_>::vector(__return_storage_ptr__);
  local_28 = 0;
  local_2c = 0;
  while( true ) {
    uVar3 = (ulong)local_2c;
    uVar4 = std::__cxx11::string::size();
    iVar1 = local_2c;
    bVar5 = false;
    if (uVar3 < uVar4) {
      iVar2 = Count(delimitador);
      uVar3 = std::__cxx11::string::size();
      bVar5 = (ulong)(long)(iVar1 + iVar2 + -1) < uVar3;
    }
    if (!bVar5) break;
    Count(delimitador);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
    String(&local_50,&local_70);
    bVar5 = operator==(&local_50,delimitador);
    ~String(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar5) {
      std::__cxx11::string::substr((ulong)&local_c0,(ulong)this);
      String(&local_a0,&local_c0);
      std::vector<Tigre::String,_std::allocator<Tigre::String>_>::push_back
                (__return_storage_ptr__,&local_a0);
      ~String(&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      iVar1 = local_2c;
      local_28 = Count(delimitador);
      local_28 = iVar1 + local_28;
    }
    local_2c = local_2c + 1;
  }
  uVar3 = (ulong)local_28;
  uVar4 = std::__cxx11::string::size();
  if (uVar3 < uVar4) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&local_100,(ulong)this);
    String(&local_e0,&local_100);
    std::vector<Tigre::String,_std::allocator<Tigre::String>_>::push_back
              (__return_storage_ptr__,&local_e0);
    ~String(&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tigre::String> Tigre::String::explode(String delimitador) {
    std::vector<Tigre::String> result;
    int last_push = 0;

    for (int i=0; i < this->value.size() && i+delimitador.Count()-1 < this->value.size(); i++) {
        if(this->value.substr(i, delimitador.Count()) == delimitador){
            result.push_back(this->value.substr(last_push, i-last_push));
            last_push = i+delimitador.Count();
        }
    }

    if(last_push < this->value.size()){
        result.push_back(this->value.substr(last_push, this->value.size()-last_push));
    }

    return result;
}